

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<unsigned_char_const>::operator==
          (ArrayPtr<unsigned_char_const> *this,ArrayPtr<unsigned_char> *other)

{
  uchar uVar1;
  size_t sVar2;
  size_t sVar3;
  uchar *puVar4;
  ulong local_28;
  size_t i;
  ArrayPtr<unsigned_char> *other_local;
  ArrayPtr<const_unsigned_char> *this_local;
  
  sVar2 = *(size_t *)(this + 8);
  sVar3 = ArrayPtr<unsigned_char>::size(other);
  if (sVar2 == sVar3) {
    for (local_28 = 0; local_28 < *(ulong *)(this + 8); local_28 = local_28 + 1) {
      uVar1 = *(uchar *)(*(long *)this + local_28);
      puVar4 = ArrayPtr<unsigned_char>::operator[](other,local_28);
      if (uVar1 != *puVar4) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==(const ArrayPtr<U>& other) const {
    if (size_ != other.size()) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }